

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

int llex(LexState *ls,SemInfo *seminfo)

{
  size_t *psVar1;
  size_t sVar2;
  ZIO *pZVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  TString *pTVar9;
  char *pcVar10;
  long lVar11;
  uint c;
  unsigned_long x;
  bool bVar12;
  char local_38 [8];
  
  ls->buff->n = 0;
LAB_0011509f:
  uVar5 = ls->current;
  switch(uVar5) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x3b:
    goto switchD_001150b6_caseD_0;
  case 9:
  case 0xb:
  case 0xc:
  case 0x20:
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    goto LAB_0011509f;
  case 10:
  case 0xd:
    inclinenumber(ls);
    goto LAB_0011509f;
  case 0x22:
  case 0x27:
    save(ls,uVar5);
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    goto LAB_001152ba;
  case 0x2d:
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    if (uVar5 != 0x2d) {
      return 0x2d;
    }
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    if (uVar5 == 0x5b) {
      iVar8 = skip_sep(ls);
      ls->buff->n = 0;
      if (iVar8 < 0) {
        uVar5 = ls->current;
        goto LAB_0011518d;
      }
      read_long_string(ls,(SemInfo *)0x0,iVar8);
      ls->buff->n = 0;
    }
    else {
LAB_0011518d:
      while ((0xe < uVar5 + 1 || ((0x4801U >> (uVar5 + 1 & 0x1f) & 1) == 0))) {
        pZVar3 = ls->z;
        sVar2 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar2 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
      }
    }
    goto LAB_0011509f;
  case 0x2e:
    save(ls,0x2e);
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar8 = check_next1(ls,0x2e);
    if (iVar8 != 0) {
      iVar8 = check_next1(ls,0x2e);
      return 0x119 - (uint)(iVar8 == 0);
    }
    if ((""[(long)ls->current + 1] & 2) == 0) {
      return 0x2e;
    }
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    iVar8 = read_numeral(ls,seminfo);
    return iVar8;
  case 0x2f:
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar7 = 0x2f;
    iVar8 = check_next1(ls,0x2f);
    bVar12 = iVar8 == 0;
    iVar8 = 0x117;
    break;
  case 0x3a:
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar7 = 0x3a;
    iVar8 = check_next1(ls,0x3a);
    bVar12 = iVar8 == 0;
    iVar8 = 0x120;
    break;
  case 0x3c:
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar8 = check_next1(ls,0x3d);
    if (iVar8 != 0) {
      return 0x11c;
    }
    iVar7 = 0x3c;
    iVar8 = check_next1(ls,0x3c);
    bVar12 = iVar8 == 0;
    iVar8 = 0x11e;
    break;
  case 0x3d:
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar7 = 0x3d;
    iVar8 = check_next1(ls,0x3d);
    bVar12 = iVar8 == 0;
    iVar8 = 0x11a;
    break;
  case 0x3e:
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    iVar8 = check_next1(ls,0x3d);
    if (iVar8 != 0) {
      return 0x11b;
    }
    iVar7 = 0x3e;
    iVar8 = check_next1(ls,0x3e);
    bVar12 = iVar8 == 0;
    iVar8 = 0x11f;
    break;
  case 0xffffffff:
    return 0x121;
  default:
    if (uVar5 != 0x5b) {
      if (uVar5 == 0x7e) {
        pZVar3 = ls->z;
        sVar2 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar2 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
        iVar8 = check_next1(ls,0x3d);
        if (iVar8 == 0) {
          return 0x7e;
        }
        return 0x11d;
      }
switchD_001150b6_caseD_0:
      if ((""[(long)(int)uVar5 + 1] & 1) == 0) {
        pZVar3 = ls->z;
        sVar2 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar2 == 0) {
          uVar6 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar6 = (uint)*pbVar4;
        }
        ls->current = uVar6;
        return uVar5;
      }
      do {
        save(ls,uVar5);
        pZVar3 = ls->z;
        sVar2 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar2 == 0) {
          uVar5 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar5 = (uint)*pbVar4;
        }
        ls->current = uVar5;
      } while ((""[(long)(int)uVar5 + 1] & 3) != 0);
      pTVar9 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
      seminfo->ts = pTVar9;
      if (pTVar9->tt == '\x04') {
        if (pTVar9->extra != 0) {
          return pTVar9->extra | 0x100;
        }
        return 0x124;
      }
      return 0x124;
    }
    iVar8 = skip_sep(ls);
    if (-1 < iVar8) {
      read_long_string(ls,seminfo,iVar8);
      return 0x125;
    }
    if (iVar8 == -1) {
      return 0x5b;
    }
    pcVar10 = "invalid long string delimiter";
    goto LAB_00115969;
  }
  if (bVar12) {
    return iVar7;
  }
  return iVar8;
LAB_001152ba:
  if (uVar6 == uVar5) {
    save(ls,uVar5);
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    pTVar9 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
    seminfo->ts = pTVar9;
    return 0x125;
  }
  if (uVar6 != 0x5c) {
    if ((uVar6 == 0xd) || (uVar6 == 10)) {
      pcVar10 = "unfinished string";
LAB_00115969:
      lexerror(ls,pcVar10,0x125);
    }
    if (uVar6 == 0xffffffff) {
      lexerror(ls,"unfinished string",0x121);
    }
    save(ls,uVar6);
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    goto LAB_0011553a;
  }
  save(ls,0x5c);
  pZVar3 = ls->z;
  sVar2 = pZVar3->n;
  pZVar3->n = pZVar3->n - 1;
  if (sVar2 == 0) {
    uVar6 = luaZ_fill(pZVar3);
  }
  else {
    pbVar4 = (byte *)pZVar3->p;
    pZVar3->p = (char *)(pbVar4 + 1);
    uVar6 = (uint)*pbVar4;
  }
  ls->current = uVar6;
  switch(uVar6) {
  case 0x6e:
    c = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x77:
  case 0x79:
switchD_0011539a_caseD_6f:
    esccheck(ls,""[(long)(int)uVar6 + 1] & 2,"invalid escape sequence");
    lVar11 = 0;
    c = 0;
    while (((int)lVar11 != 3 && (iVar8 = ls->current, (""[(long)iVar8 + 1] & 2) != 0))) {
      save(ls,iVar8);
      pZVar3 = ls->z;
      sVar2 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar2 == 0) {
        uVar6 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar6 = (uint)*pbVar4;
      }
      c = (c * 10 + iVar8) - 0x30;
      ls->current = uVar6;
      lVar11 = lVar11 + 1;
    }
    esccheck(ls,(uint)((int)c < 0x100),"decimal escape too large");
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - lVar11;
    goto LAB_00115527;
  case 0x72:
    c = 0xd;
    break;
  case 0x74:
    c = 9;
    break;
  case 0x75:
    save(ls,0x75);
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    esccheck(ls,(uint)(uVar6 == 0x7b),"missing \'{\'");
    iVar8 = gethexa(ls);
    x = (unsigned_long)iVar8;
    lVar11 = -4;
    while( true ) {
      save(ls,ls->current);
      pZVar3 = ls->z;
      sVar2 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar2 == 0) {
        uVar6 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar6 = (uint)*pbVar4;
      }
      ls->current = uVar6;
      if ((""[(long)(int)uVar6 + 1] & 0x10) == 0) break;
      iVar8 = luaO_hexavalue(uVar6);
      x = x * 0x10 + (long)iVar8;
      esccheck(ls,(uint)(x < 0x110000),"UTF-8 value too large");
      lVar11 = lVar11 + -1;
    }
    esccheck(ls,(uint)(uVar6 == 0x7d),"missing \'}\'");
    pZVar3 = ls->z;
    sVar2 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar2 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 + lVar11;
    iVar8 = luaO_utf8esc(local_38,x);
    lVar11 = (long)iVar8;
    pcVar10 = &stack0xffffffffffffffd0 + -lVar11;
    for (; 0 < lVar11; lVar11 = lVar11 + -1) {
      save(ls,(int)*pcVar10);
      pcVar10 = pcVar10 + 1;
    }
    goto LAB_0011553a;
  case 0x76:
    c = 0xb;
    break;
  case 0x78:
    iVar8 = gethexa(ls);
    iVar7 = gethexa(ls);
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - 2;
    c = iVar7 + iVar8 * 0x10;
    break;
  case 0x7a:
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - 1;
    do {
      pZVar3 = ls->z;
      sVar2 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar2 == 0) {
        uVar6 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar6 = (uint)*pbVar4;
      }
      ls->current = uVar6;
      while( true ) {
        if ((""[(long)(int)uVar6 + 1] & 8) == 0) goto LAB_0011553a;
        if ((uVar6 != 0xd) && (uVar6 != 10)) break;
        inclinenumber(ls);
        uVar6 = ls->current;
      }
    } while( true );
  default:
    if (uVar6 != 0xffffffff) {
      if ((uVar6 != 10) && (uVar6 != 0xd)) {
        c = uVar6;
        if ((uVar6 != 0x22) && (((uVar6 != 0x27 && (uVar6 != 0x5c)) && (c = 7, uVar6 != 0x61)))) {
          if (uVar6 == 0x66) {
            c = 0xc;
          }
          else {
            if (uVar6 != 0x62) goto switchD_0011539a_caseD_6f;
            c = 8;
          }
        }
        break;
      }
      inclinenumber(ls);
      c = 10;
      goto LAB_00115527;
    }
    goto LAB_0011553a;
  }
  pZVar3 = ls->z;
  sVar2 = pZVar3->n;
  pZVar3->n = pZVar3->n - 1;
  if (sVar2 == 0) {
    uVar6 = luaZ_fill(pZVar3);
  }
  else {
    pbVar4 = (byte *)pZVar3->p;
    pZVar3->p = (char *)(pbVar4 + 1);
    uVar6 = (uint)*pbVar4;
  }
  ls->current = uVar6;
LAB_00115527:
  psVar1 = &ls->buff->n;
  *psVar1 = *psVar1 - 1;
  save(ls,c);
LAB_0011553a:
  uVar6 = ls->current;
  goto LAB_001152ba;
}

Assistant:

static int llex(LexState *ls, SemInfo *seminfo) {
    luaZ_resetbuffer(ls->buff);
    for (;;) {
        switch (ls->current) {
            case '\n':
            case '\r': {  /* line breaks */
                inclinenumber(ls);
                break;
            }
            case ' ':
            case '\f':
            case '\t':
            case '\v': {  /* spaces */
                next(ls);
                break;
            }
            case '-': {  /* '-' or '--' (comment) */
                next(ls);
                if (ls->current != '-') return '-';
                /* else is a comment */
                next(ls);
                if (ls->current == '[') {  /* long comment? */
                    int sep = skip_sep(ls);
                    luaZ_resetbuffer(ls->buff);  /* 'skip_sep' may dirty the buffer */
                    if (sep >= 0) {
                        read_long_string(ls, NULL, sep);  /* skip long comment */
                        luaZ_resetbuffer(ls->buff);  /* previous call may dirty the buff. */
                        break;
                    }
                }
                /* else short comment */
                while (!currIsNewline(ls) && ls->current != EOZ)
                    next(ls);  /* skip until end of line (or end of file) */
                break;
            }
            case '[': {  /* long string or simply '[' */
                int sep = skip_sep(ls);
                if (sep >= 0) {
                    read_long_string(ls, seminfo, sep);
                    return TK_STRING;
                } else if (sep != -1)  /* '[=...' missing second bracket */
                    lexerror(ls, "invalid long string delimiter", TK_STRING);
                return '[';
            }
            case '=': {
                next(ls);
                if (check_next1(ls, '=')) return TK_EQ;
                else return '=';
            }
            case '<': {
                next(ls);
                if (check_next1(ls, '=')) return TK_LE;
                else if (check_next1(ls, '<')) return TK_SHL;
                else return '<';
            }
            case '>': {
                next(ls);
                if (check_next1(ls, '=')) return TK_GE;
                else if (check_next1(ls, '>')) return TK_SHR;
                else return '>';
            }
            case '/': {
                next(ls);
                if (check_next1(ls, '/')) return TK_IDIV;
                else return '/';
            }
            case '~': {
                next(ls);
                if (check_next1(ls, '=')) return TK_NE;
                else return '~';
            }
            case ':': {
                next(ls);
                if (check_next1(ls, ':')) return TK_DBCOLON;
                else return ':';
            }
            case '"':
            case '\'': {  /* short literal strings */
                read_string(ls, ls->current, seminfo);
                return TK_STRING;
            }
            case '.': {  /* '.', '..', '...', or number */
                save_and_next(ls);
                if (check_next1(ls, '.')) {
                    if (check_next1(ls, '.'))
                        return TK_DOTS;   /* '...' */
                    else return TK_CONCAT;   /* '..' */
                } else if (!lisdigit(ls->current)) return '.';
                else return read_numeral(ls, seminfo);
            }
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9': {
                return read_numeral(ls, seminfo);
            }
            case EOZ: {
                return TK_EOS;
            }
            default: {
                if (lislalpha(ls->current)) {  /* identifier or reserved word? */
                    TString *ts;
                    do {
                        save_and_next(ls);
                    } while (lislalnum(ls->current));
                    ts = luaX_newstring(ls, luaZ_buffer(ls->buff),
                                        luaZ_bufflen(ls->buff));
                    seminfo->ts = ts;
                    if (isreserved(ts))  /* reserved word? */
                        return ts->extra - 1 + FIRST_RESERVED;
                    else {
                        return TK_NAME;
                    }
                } else {  /* single-char tokens (+ - / ...) */
                    int c = ls->current;
                    next(ls);
                    return c;
                }
            }
        }
    }
}